

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v7::basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::grow
          (basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *this,size_t size)

{
  wchar_t *__src;
  size_t sVar1;
  pointer __dest;
  ulong uVar2;
  
  __src = (this->super_buffer<wchar_t>).ptr_;
  uVar2 = (this->super_buffer<wchar_t>).capacity_;
  uVar2 = (uVar2 >> 1) + uVar2;
  if (uVar2 <= size) {
    uVar2 = size;
  }
  __dest = std::allocator_traits<std::allocator<wchar_t>_>::allocate
                     ((allocator_type *)&this->field_0x7f0,uVar2);
  sVar1 = (this->super_buffer<wchar_t>).size_;
  if (sVar1 != 0) {
    memmove(__dest,__src,sVar1 << 2);
  }
  (this->super_buffer<wchar_t>).ptr_ = __dest;
  (this->super_buffer<wchar_t>).capacity_ = uVar2;
  if (__src != this->store_) {
    operator_delete(__src);
    return;
  }
  return;
}

Assistant:

void basic_memory_buffer<T, SIZE, Allocator>::grow(size_t size) {
#ifdef FMT_FUZZ
  if (size > 5000) throw std::runtime_error("fuzz mode - won't grow that much");
#endif
  size_t old_capacity = this->capacity();
  size_t new_capacity = old_capacity + old_capacity / 2;
  if (size > new_capacity) new_capacity = size;
  T* old_data = this->data();
  T* new_data =
      std::allocator_traits<Allocator>::allocate(alloc_, new_capacity);
  // The following code doesn't throw, so the raw pointer above doesn't leak.
  std::uninitialized_copy(old_data, old_data + this->size(),
                          detail::make_checked(new_data, new_capacity));
  this->set(new_data, new_capacity);
  // deallocate must not throw according to the standard, but even if it does,
  // the buffer already uses the new storage and will deallocate it in
  // destructor.
  if (old_data != store_) alloc_.deallocate(old_data, old_capacity);
}